

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::TimeZoneFormat::format
          (TimeZoneFormat *this,UTimeZoneFormatStyle style,TimeZone *tz,UDate date,
          UnicodeString *name,UTimeZoneFormatTimeType *timeType)

{
  short sVar1;
  bool bVar2;
  UChar *pUVar3;
  UBool useUtcIndicator;
  UTimeZoneNameType dstType;
  UBool UVar4;
  UTimeZoneNameType stdType;
  int32_t iVar5;
  UBool isShort;
  UBool ignoreSeconds;
  UChar *srcChars;
  int32_t dstOffset;
  UErrorCode status;
  UTimeZoneFormatTimeType *local_40;
  int32_t rawOffset;
  
  if (timeType != (UTimeZoneFormatTimeType *)0x0) {
    *timeType = UTZFMT_TIME_TYPE_UNKNOWN;
  }
  bVar2 = false;
  switch(style) {
  case UTZFMT_STYLE_GENERIC_LOCATION:
    iVar5 = 1;
    goto LAB_001fc29d;
  case UTZFMT_STYLE_GENERIC_LONG:
    iVar5 = 2;
    goto LAB_001fc29d;
  case UTZFMT_STYLE_GENERIC_SHORT:
    iVar5 = 4;
LAB_001fc29d:
    formatGeneric(this,tz,iVar5,date,name);
LAB_001fc2e0:
    bVar2 = false;
    break;
  case UTZFMT_STYLE_SPECIFIC_LONG:
    stdType = UTZNM_LONG_STANDARD;
    dstType = UTZNM_LONG_DAYLIGHT;
    goto LAB_001fc2cf;
  case UTZFMT_STYLE_SPECIFIC_SHORT:
    stdType = UTZNM_SHORT_STANDARD;
    dstType = UTZNM_SHORT_DAYLIGHT;
LAB_001fc2cf:
    formatSpecific(this,tz,stdType,dstType,date,name,timeType);
    goto LAB_001fc2e0;
  case UTZFMT_STYLE_ZONE_ID:
    UnicodeString::operator=(name,&tz->fID);
    goto LAB_001fc288;
  case UTZFMT_STYLE_ZONE_ID_SHORT:
    local_40 = timeType;
    pUVar3 = ZoneMeta::getShortID(tz);
    srcChars = L"unk";
    if (pUVar3 != (UChar *)0x0) {
      srcChars = pUVar3;
    }
    UnicodeString::unBogus(name);
    sVar1 = (name->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar5 = (name->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)sVar1 >> 5;
    }
    UnicodeString::doReplace(name,0,iVar5,srcChars,0,-1);
    bVar2 = true;
    timeType = local_40;
    break;
  case UTZFMT_STYLE_EXEMPLAR_LOCATION:
    formatExemplarLocation(this,tz,name);
LAB_001fc288:
    bVar2 = true;
  }
  if (bVar2) {
    return name;
  }
  if (0x1f < (ushort)(name->fUnion).fStackFields.fLengthAndFlags) {
    return name;
  }
  status = U_ZERO_ERROR;
  local_40 = timeType;
  (*(tz->super_UObject)._vptr_UObject[6])(date,tz,0,&rawOffset,&dstOffset);
  if (U_ZERO_ERROR < status) {
    return name;
  }
  if (UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FULL < style) goto LAB_001fc40e;
  switch(style) {
  default:
    UVar4 = '\0';
    break;
  case UTZFMT_STYLE_GENERIC_SHORT:
  case UTZFMT_STYLE_SPECIFIC_SHORT:
  case UTZFMT_STYLE_LOCALIZED_GMT_SHORT:
    UVar4 = '\x01';
    break;
  case UTZFMT_STYLE_ISO_BASIC_SHORT:
    useUtcIndicator = '\x01';
    goto LAB_001fc3c4;
  case UTZFMT_STYLE_ISO_BASIC_LOCAL_SHORT:
    useUtcIndicator = '\0';
LAB_001fc3c4:
    UVar4 = '\x01';
    isShort = '\x01';
LAB_001fc3fc:
    ignoreSeconds = '\x01';
LAB_001fc402:
    formatOffsetISO8601((TimeZoneFormat *)tz,dstOffset + rawOffset,UVar4,useUtcIndicator,isShort,
                        ignoreSeconds,name,&status);
    goto LAB_001fc40e;
  case UTZFMT_STYLE_ISO_BASIC_FIXED:
    UVar4 = '\x01';
    goto LAB_001fc3f4;
  case UTZFMT_STYLE_ISO_BASIC_LOCAL_FIXED:
    UVar4 = '\x01';
    goto LAB_001fc3ad;
  case UTZFMT_STYLE_ISO_BASIC_FULL:
    UVar4 = '\x01';
    goto LAB_001fc3e5;
  case UTZFMT_STYLE_ISO_BASIC_LOCAL_FULL:
    UVar4 = '\x01';
    goto LAB_001fc3d8;
  case UTZFMT_STYLE_ISO_EXTENDED_FIXED:
    UVar4 = '\0';
LAB_001fc3f4:
    useUtcIndicator = '\x01';
LAB_001fc3f9:
    isShort = '\0';
    goto LAB_001fc3fc;
  case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FIXED:
    UVar4 = '\0';
LAB_001fc3ad:
    useUtcIndicator = '\0';
    goto LAB_001fc3f9;
  case UTZFMT_STYLE_ISO_EXTENDED_FULL:
    UVar4 = '\0';
LAB_001fc3e5:
    useUtcIndicator = '\x01';
LAB_001fc3ea:
    isShort = '\0';
    ignoreSeconds = '\0';
    goto LAB_001fc402;
  case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FULL:
    UVar4 = '\0';
LAB_001fc3d8:
    useUtcIndicator = '\0';
    goto LAB_001fc3ea;
  }
  formatOffsetLocalizedGMT(this,dstOffset + rawOffset,UVar4,name,&status);
LAB_001fc40e:
  if (local_40 != (UTimeZoneFormatTimeType *)0x0) {
    *local_40 = UTZFMT_TIME_TYPE_DAYLIGHT - (dstOffset == 0);
  }
  return name;
}

Assistant:

UnicodeString&
TimeZoneFormat::format(UTimeZoneFormatStyle style, const TimeZone& tz, UDate date,
        UnicodeString& name, UTimeZoneFormatTimeType* timeType /* = NULL */) const {
    if (timeType) {
        *timeType = UTZFMT_TIME_TYPE_UNKNOWN;
    }

    UBool noOffsetFormatFallback = FALSE;

    switch (style) {
    case UTZFMT_STYLE_GENERIC_LOCATION:
        formatGeneric(tz, UTZGNM_LOCATION, date, name);
        break;
    case UTZFMT_STYLE_GENERIC_LONG:
        formatGeneric(tz, UTZGNM_LONG, date, name);
        break;
    case UTZFMT_STYLE_GENERIC_SHORT:
        formatGeneric(tz, UTZGNM_SHORT, date, name);
        break;
    case UTZFMT_STYLE_SPECIFIC_LONG:
        formatSpecific(tz, UTZNM_LONG_STANDARD, UTZNM_LONG_DAYLIGHT, date, name, timeType);
        break;
    case UTZFMT_STYLE_SPECIFIC_SHORT:
        formatSpecific(tz, UTZNM_SHORT_STANDARD, UTZNM_SHORT_DAYLIGHT, date, name, timeType);
        break;

    case UTZFMT_STYLE_ZONE_ID:
        tz.getID(name);
        noOffsetFormatFallback = TRUE;
        break;
    case UTZFMT_STYLE_ZONE_ID_SHORT:
        {
            const UChar* shortID = ZoneMeta::getShortID(tz);
            if (shortID == NULL) {
                shortID = UNKNOWN_SHORT_ZONE_ID;
            }
            name.setTo(shortID, -1);
        }
        noOffsetFormatFallback = TRUE;
        break;

    case UTZFMT_STYLE_EXEMPLAR_LOCATION:
        formatExemplarLocation(tz, name);
        noOffsetFormatFallback = TRUE;
        break;

    default:
        // will be handled below
        break;
    }

    if (name.isEmpty() && !noOffsetFormatFallback) {
        UErrorCode status = U_ZERO_ERROR;
        int32_t rawOffset, dstOffset;
        tz.getOffset(date, FALSE, rawOffset, dstOffset, status);
        int32_t offset = rawOffset + dstOffset;
        if (U_SUCCESS(status)) {
            switch (style) {
            case UTZFMT_STYLE_GENERIC_LOCATION:
            case UTZFMT_STYLE_GENERIC_LONG:
            case UTZFMT_STYLE_SPECIFIC_LONG:
            case UTZFMT_STYLE_LOCALIZED_GMT:
                formatOffsetLocalizedGMT(offset, name, status);
                break;

            case UTZFMT_STYLE_GENERIC_SHORT:
            case UTZFMT_STYLE_SPECIFIC_SHORT:
            case UTZFMT_STYLE_LOCALIZED_GMT_SHORT:
                formatOffsetShortLocalizedGMT(offset, name, status);
                break;

            case UTZFMT_STYLE_ISO_BASIC_SHORT:
                formatOffsetISO8601Basic(offset, TRUE, TRUE, TRUE, name, status);
                break;

            case UTZFMT_STYLE_ISO_BASIC_LOCAL_SHORT:
                formatOffsetISO8601Basic(offset, FALSE, TRUE, TRUE, name, status);
                break;

            case UTZFMT_STYLE_ISO_BASIC_FIXED:
                formatOffsetISO8601Basic(offset, TRUE, FALSE, TRUE, name, status);
                break;

            case UTZFMT_STYLE_ISO_BASIC_LOCAL_FIXED:
                formatOffsetISO8601Basic(offset, FALSE, FALSE, TRUE, name, status);
                break;

            case UTZFMT_STYLE_ISO_EXTENDED_FIXED:
                formatOffsetISO8601Extended(offset, TRUE, FALSE, TRUE, name, status);
                break;

            case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FIXED:
                formatOffsetISO8601Extended(offset, FALSE, FALSE, TRUE, name, status);
                break;

            case UTZFMT_STYLE_ISO_BASIC_FULL:
                formatOffsetISO8601Basic(offset, TRUE, FALSE, FALSE, name, status);
                break;

            case UTZFMT_STYLE_ISO_BASIC_LOCAL_FULL:
                formatOffsetISO8601Basic(offset, FALSE, FALSE, FALSE, name, status);
                break;

            case UTZFMT_STYLE_ISO_EXTENDED_FULL:
                formatOffsetISO8601Extended(offset, TRUE, FALSE, FALSE, name, status);
                break;

            case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FULL:
                formatOffsetISO8601Extended(offset, FALSE, FALSE, FALSE, name, status);
                break;

            default:
              // UTZFMT_STYLE_ZONE_ID, UTZFMT_STYLE_ZONE_ID_SHORT, UTZFMT_STYLE_EXEMPLAR_LOCATION
              break;
            }

            if (timeType) {
                *timeType = (dstOffset != 0) ? UTZFMT_TIME_TYPE_DAYLIGHT : UTZFMT_TIME_TYPE_STANDARD;
            }
        }
    }

    return name;
}